

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmaker.cpp
# Opt level: O0

void __thiscall banksia::JsonMaker::JsonMaker(JsonMaker *this)

{
  Obj *in_RDI;
  Timer *in_stack_00000010;
  allocator local_1d [20];
  allocator local_9 [9];
  
  Obj::Obj(in_RDI);
  Tickable::Tickable((Tickable *)0x1dbf86);
  in_RDI->_vptr_Obj = (_func_int **)&PTR__JsonMaker_00258890;
  in_RDI[1]._vptr_Obj = (_func_int **)&DAT_002588d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 7),"tour.json",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"engines.json",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  *(undefined4 *)&in_RDI[0xf]._vptr_Obj = 0;
  *(undefined4 *)((long)&in_RDI[0xf]._vptr_Obj + 4) = 600;
  *(undefined4 *)&in_RDI[0x10]._vptr_Obj = 4;
  *(undefined4 *)((long)&in_RDI[0x10]._vptr_Obj + 4) = 0;
  std::vector<banksia::Config,_std::allocator<banksia::Config>_>::vector
            ((vector<banksia::Config,_std::allocator<banksia::Config>_> *)0x1dc051);
  std::vector<banksia::JsonEngine_*,_std::allocator<banksia::JsonEngine_*>_>::vector
            ((vector<banksia::JsonEngine_*,_std::allocator<banksia::JsonEngine_*>_> *)0x1dc067);
  std::vector<banksia::Config,_std::allocator<banksia::Config>_>::vector
            ((vector<banksia::Config,_std::allocator<banksia::Config>_> *)0x1dc07d);
  CppTime::Timer::Timer(in_stack_00000010);
  std::__cxx11::string::string((string *)(in_RDI + 0x3c));
  std::__cxx11::string::string((string *)(in_RDI + 0x40));
  std::__cxx11::string::string((string *)(in_RDI + 0x44));
  return;
}

Assistant:

JsonMaker::JsonMaker()
{
}